

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-prim-types.cc
# Opt level: O2

void prim_add_test(void)

{
  bool bVar1;
  allocator local_5a79;
  string local_5a78;
  Prim root;
  Prim dprim;
  Prim cprim;
  Prim bprim;
  Prim aprim;
  Model rootmodel;
  Model dmodel;
  Model cmodel;
  Model bmodel;
  Model amodel;
  
  tinyusdz::Model::Model(&amodel);
  tinyusdz::Model::Model(&bmodel);
  tinyusdz::Model::Model(&cmodel);
  tinyusdz::Model::Model(&dmodel);
  tinyusdz::Model::Model(&rootmodel);
  std::__cxx11::string::string((string *)&bprim,"test01",(allocator *)&cprim);
  tinyusdz::Prim::Prim<tinyusdz::Model>(&aprim,(string *)&bprim,&amodel);
  std::__cxx11::string::~string((string *)&bprim);
  std::__cxx11::string::string((string *)&cprim,"test02",(allocator *)&dprim);
  tinyusdz::Prim::Prim<tinyusdz::Model>(&bprim,(string *)&cprim,&bmodel);
  std::__cxx11::string::~string((string *)&cprim);
  std::__cxx11::string::string((string *)&dprim,"test01",(allocator *)&root);
  tinyusdz::Prim::Prim<tinyusdz::Model>(&cprim,(string *)&dprim,&cmodel);
  std::__cxx11::string::~string((string *)&dprim);
  std::__cxx11::string::string((string *)&root,"test02",(allocator *)&local_5a78);
  tinyusdz::Prim::Prim<tinyusdz::Model>(&dprim,(string *)&root,&dmodel);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::string((string *)&local_5a78,"root",&local_5a79);
  tinyusdz::Prim::Prim<tinyusdz::Model>(&root,&local_5a78,&rootmodel);
  std::__cxx11::string::~string((string *)&local_5a78);
  bVar1 = tinyusdz::Prim::add_child(&root,&aprim,true,(string *)0x0);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x84,"%s","root.add_child(std::move(aprim))");
  bVar1 = tinyusdz::Prim::add_child(&root,&bprim,true,(string *)0x0);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x86,"%s","root.add_child(std::move(bprim))");
  bVar1 = tinyusdz::Prim::add_child(&root,&cprim,false,(string *)0x0);
  acutest_check_((uint)!bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x89,"%s","!root.add_child(std::move(cprim), false)");
  bVar1 = tinyusdz::Prim::add_child(&root,&dprim,true,(string *)0x0);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x8c,"%s","root.add_child(std::move(dprim), true)");
  tinyusdz::Prim::~Prim(&root);
  tinyusdz::Prim::~Prim(&dprim);
  tinyusdz::Prim::~Prim(&cprim);
  tinyusdz::Prim::~Prim(&bprim);
  tinyusdz::Prim::~Prim(&aprim);
  tinyusdz::Model::~Model(&rootmodel);
  tinyusdz::Model::~Model(&dmodel);
  tinyusdz::Model::~Model(&cmodel);
  tinyusdz::Model::~Model(&bmodel);
  tinyusdz::Model::~Model(&amodel);
  return;
}

Assistant:

void prim_add_test(void) {
  Model amodel;
  Model bmodel;
  Model cmodel;
  Model dmodel;
  Model rootmodel;

  Prim aprim("test01", amodel);
  Prim bprim("test02", bmodel);
  Prim cprim("test01", cmodel);
  Prim dprim("test02", dmodel);
  Prim root("root", rootmodel);

  TEST_CHECK(root.add_child(std::move(aprim)));

  TEST_CHECK(root.add_child(std::move(bprim)));

  // cannot add child Prim with same elementName
  TEST_CHECK(!root.add_child(std::move(cprim), /* rename_if_required */false)); 

  // can add child Prim with renaming
  TEST_CHECK(root.add_child(std::move(dprim), /* rename_if_required */true)); 
  
}